

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  int32 *__rwlock;
  ulong uVar1;
  element_type *peVar2;
  long lVar3;
  buffer *buf;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  uint *puVar6;
  _Alloc_hider _Var7;
  peer *ppVar8;
  undefined8 uVar9;
  undefined8 *puVar10;
  iterator iVar11;
  size_t sVar12;
  runtime_error *this_00;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  ptr<resp_msg> pVar14;
  undefined1 auVar15 [16];
  undefined1 local_139;
  uint *local_138;
  _Alloc_hider _Stack_130;
  peer *local_128;
  undefined1 auStack_120 [32];
  _Any_data local_100;
  req_msg local_f0 [2];
  char *local_38;
  
  peVar2 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar10 = (undefined8 *)operator_new(0x40);
  puVar10[1] = 0x100000001;
  *puVar10 = &PTR___Sp_counted_ptr_inplace_00178730;
  puVar10[3] = peVar2;
  *(undefined4 *)(puVar10 + 4) = 7;
  uVar1 = (req->super_msg_base).term_;
  *(ulong *)((long)puVar10 + 0x24) = CONCAT44((int)uVar1,(int)(uVar1 >> 0x20));
  puVar10[2] = &PTR__msg_base_00178780;
  puVar10[6] = 0;
  *(undefined1 *)(puVar10 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar10;
  this->_vptr_raft_server = (_func_int **)(puVar10 + 2);
  if ((*(long *)(in_RDX + 0x40) - (long)*(long **)(in_RDX + 0x38) == 0x10) &&
     (lVar3 = **(long **)(in_RDX + 0x38), *(int *)(lVar3 + 8) == 3)) {
    if (*(int *)&req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == 3) {
      buf = *(buffer **)(lVar3 + 0x18);
      if (buf == (buffer *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"get_buf cannot be called for a log_entry with nil buffer");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      srv_config::deserialize((srv_config *)&local_138,buf);
      __rwlock = &req[2].super_msg_base.dst_;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)__rwlock);
      local_100._0_4_ = *local_138;
      iVar11 = std::
               _Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&req[1].commit_idx_,(key_type_conflict *)local_100._M_pod_data);
      if ((iVar11.
           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false>
           ._M_cur == (__node_type *)0x0) &&
         (*(uint *)((long)&(req->super_msg_base).term_ + 4) != *local_138)) {
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        _Var7._M_p = _Stack_130._M_p;
        puVar6 = local_138;
        if (*(char *)((long)&req->last_log_idx_ + 1) == '\x01') {
          plVar4 = (long *)req[4].last_log_term_;
          local_100._M_unused._M_object = local_f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,"previous config has not committed yet","");
          (**(code **)(*plVar4 + 0x18))(plVar4,&local_100);
          _Var13._M_pi = extraout_RDX_04;
          if ((req_msg *)local_100._M_unused._0_8_ != local_f0) {
            operator_delete(local_100._M_unused._M_object,
                            (ulong)((long)local_f0[0].super_msg_base._vptr_msg_base + 1));
            _Var13._M_pi = extraout_RDX_05;
          }
        }
        else {
          local_138 = (uint *)0x0;
          _Stack_130._M_p = (pointer)0x0;
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req[5].last_log_idx_;
          req[5].last_log_term_ = (ulong)puVar6;
          req[5].last_log_idx_ = (ulong)_Var7._M_p;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          local_100._8_8_ = 0;
          local_f0[0].super_msg_base.term_ =
               (ulong)std::
                      _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
                      ::_M_invoke;
          local_f0[0].super_msg_base._vptr_msg_base =
               (_func_int **)
               std::
               _Function_handler<void_(cornerstone::peer_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/src/raft_server_req_handlers.cxx:507:40)>
               ::_M_manager;
          local_128 = (peer *)0x0;
          local_100._M_unused._M_object = req;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<cornerstone::peer,std::allocator<cornerstone::peer>,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_120,&local_128,
                     (allocator<cornerstone::peer> *)&local_139,
                     (shared_ptr<cornerstone::srv_config> *)&req[5].last_log_term_,
                     (context *)
                     (req->log_entries_).
                     super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (function<void_(cornerstone::peer_&)> *)&local_100);
          uVar9 = auStack_120._0_8_;
          ppVar8 = local_128;
          local_128 = (peer *)0x0;
          auStack_120._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&req[5].super_msg_base.dst_;
          *(peer **)&req[5].super_msg_base.type_ = ppVar8;
          *(undefined8 *)&req[5].super_msg_base.dst_ = uVar9;
          if ((p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_120._0_8_ !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_120._0_8_);
          }
          invite_srv_to_join_cluster((raft_server *)req);
          auVar15 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
          _Var13._M_pi = auVar15._8_8_;
          puVar10[6] = auVar15._0_8_;
          *(undefined1 *)(puVar10 + 7) = 1;
          if (local_f0[0].super_msg_base._vptr_msg_base != (_func_int **)0x0) {
            (*(code *)local_f0[0].super_msg_base._vptr_msg_base)(&local_100,&local_100,3);
            _Var13._M_pi = extraout_RDX_06;
          }
        }
      }
      else {
        plVar4 = (long *)req[4].last_log_term_;
        local_38 = "the server to be added has a duplicated id with existing server %d";
        snprintf(local_100._M_pod_data,200,
                 "the server to be added has a duplicated id with existing server %d",
                 (ulong)*local_138);
        local_128 = (peer *)(auStack_120 + 8);
        sVar12 = strlen(local_100._M_pod_data);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,&local_100,(long)&local_100 + sVar12);
        (**(code **)(*plVar4 + 0x20))(plVar4,&local_128);
        if (local_128 != (peer *)(auStack_120 + 8)) {
          operator_delete(local_128,auStack_120._8_8_ + 1);
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        _Var13._M_pi = extraout_RDX_02;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_130._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_130._M_p);
        _Var13._M_pi = extraout_RDX_03;
      }
      goto LAB_0014d37f;
    }
    plVar4 = (long *)req[4].last_log_term_;
    local_100._M_unused._M_object = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"this is not a leader, cannot handle AddServerRequest","");
    (**(code **)(*plVar4 + 0x18))(plVar4,&local_100);
    _Var13._M_pi = extraout_RDX_01;
  }
  else {
    plVar4 = (long *)req[4].last_log_term_;
    local_100._M_unused._M_object = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,
               "bad add server request as we are expecting one log entry with value type of ClusterServer"
               ,"");
    (**(code **)(*plVar4 + 0x10))(plVar4,&local_100);
    _Var13._M_pi = extraout_RDX;
  }
  if ((req_msg *)local_100._M_unused._0_8_ != local_f0) {
    operator_delete(local_100._M_unused._M_object,
                    (ulong)((long)local_f0[0].super_msg_base._vptr_msg_base + 1));
    _Var13._M_pi = extraout_RDX_00;
  }
LAB_0014d37f:
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::add_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::cluster_server)
    {
        l_->debug("bad add server request as we are expecting one log entry with value type of ClusterServer");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle AddServerRequest");
        return resp;
    }

    ptr<srv_config> srv_conf(srv_config::deserialize(entries[0]->get_buf()));
    {
        read_lock(peers_lock_);
        if (peers_.find(srv_conf->get_id()) != peers_.end() || id_ == srv_conf->get_id())
        {
            l_->warn(
                lstrfmt("the server to be added has a duplicated id with existing server %d").fmt(srv_conf->get_id()));
            return resp;
        }
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
    srv_to_join_ = cs_new<peer>(conf_to_add_, *ctx_, exec);
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}